

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O0

shared_ptr<const_iDynTree::XMLDocument> __thiscall iDynTree::XMLParser::document(XMLParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<const_iDynTree::XMLDocument> sVar1;
  shared_ptr<iDynTree::XMLDocument> *in_stack_ffffffffffffffd8;
  element_type *this_00;
  
  this_00 = in_RDI;
  std::
  unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
  ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                *)0x1292a5);
  std::shared_ptr<iDynTree::XMLDocument_const>::shared_ptr<iDynTree::XMLDocument,void>
            ((shared_ptr<const_iDynTree::XMLDocument> *)this_00,in_stack_ffffffffffffffd8);
  sVar1.super___shared_ptr<const_iDynTree::XMLDocument,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_iDynTree::XMLDocument,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<const_iDynTree::XMLDocument>)
         sVar1.super___shared_ptr<const_iDynTree::XMLDocument,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const XMLDocument> XMLParser::document() const
    {
        assert(m_pimpl);
        return m_pimpl->m_document;
    }